

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.hpp
# Opt level: O1

uint32_t InstructionSet::x86::
         address<(InstructionSet::x86::Source)24,unsigned_short,(InstructionSet::x86::AccessType)2,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                   (Instruction<false> *instruction,DataPointer pointer,Context *context)

{
  ushort uVar1;
  ulong uVar2;
  type_conflict2 tVar3;
  type_conflict2 tVar4;
  ulong in_RAX;
  uint16_t zero;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX & 0xffffffffffff;
  tVar3 = resolve<unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                    (instruction,(&DAT_004d2bb8)[(ushort)pointer >> 0xb & 7],pointer,context,
                     (unsigned_short *)((long)&uStack_38 + 6),(unsigned_short *)0x0);
  uVar2 = uStack_38;
  uStack_38._0_4_ = (uint)(ushort)uStack_38;
  uStack_38._6_2_ = SUB82(uVar2,6);
  uStack_38._0_6_ =
       CONCAT24(*(undefined2 *)
                 ((long)instruction->extensions_ + (ulong)(instruction->mem_exts_source_ >> 4 & 2)),
                (uint)uStack_38);
  uVar1 = *(ushort *)((long)&uStack_38 + (ulong)(instruction->mem_exts_source_ >> 5 & 2) + 2);
  tVar4 = resolve<unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                    (instruction,pointer.sib_.sib_.sib_ & BH,pointer,context,(unsigned_short *)0x0,
                     (unsigned_short *)0x0);
  return (uint)tVar4 + (uint)tVar3 + (uint)uVar1;
}

Assistant:

uint32_t address(
	InstructionT &instruction,
	DataPointer pointer,
	ContextT &context
) {
	if constexpr (source == Source::DirectAddress) {
		return instruction.offset();
	}

	uint32_t address;
	uint16_t zero = 0;
	address = resolve<uint16_t, AccessType::Read>(instruction, pointer.index(), pointer, context, &zero);
	if constexpr (is_32bit(ContextT::model)) {
		address <<= pointer.scale();
	}
	address += instruction.offset();

	if constexpr (source == Source::IndirectNoBase) {
		return address;
	}
	return address + resolve<uint16_t, AccessType::Read>(instruction, pointer.base(), pointer, context);
}